

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O2

string * __thiscall
OSTEI_Writer::FunctionPrototype__abi_cxx11_
          (string *__return_storage_ptr__,OSTEI_Writer *this,QAM *am)

{
  ostream *poVar1;
  QAM *this_00;
  allocator local_259;
  string indent;
  string local_238;
  string local_218;
  string fname;
  undefined1 local_1d8 [48];
  stringstream ss;
  ostream local_198 [376];
  
  this_00 = am;
  QAM::QAM((QAM *)local_1d8,am);
  FunctionName__abi_cxx11_(&fname,(OSTEI_Writer *)this_00,(QAM *)local_1d8);
  std::__cxx11::string::~string((string *)(local_1d8 + 0x10));
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)fname._M_string_length + '\x05');
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_198,"int ");
  poVar1 = std::operator<<(poVar1,(string *)&fname);
  std::operator<<(poVar1,"(");
  std::operator<<(local_198,"struct simint_multi_shellpair const P,\n");
  poVar1 = std::operator<<(local_198,(string *)&indent);
  std::operator<<(poVar1,"struct simint_multi_shellpair const Q,\n");
  poVar1 = std::operator<<(local_198,(string *)&indent);
  std::operator<<(poVar1,"double screen_tol,\n");
  poVar1 = std::operator<<(local_198,(string *)&indent);
  std::operator<<(poVar1,"double * const restrict work,\n");
  poVar1 = std::operator<<(local_198,(string *)&indent);
  poVar1 = std::operator<<(poVar1,"double * const restrict ");
  std::__cxx11::string::string((string *)&local_238,"",&local_259);
  ArrVarName(&local_218,am,&local_238);
  poVar1 = std::operator<<(poVar1,(string *)&local_218);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&fname);
  return __return_storage_ptr__;
}

Assistant:

std::string OSTEI_Writer::FunctionPrototype_(QAM am) const
{
    std::string fname = FunctionName_(am);
    std::string indent(fname.length()+1+4, ' '); // +4 for return type

    std::stringstream ss;
    ss << "int " << fname << "(";
    ss << "struct simint_multi_shellpair const P,\n";
    ss << indent << "struct simint_multi_shellpair const Q,\n";
    ss << indent << "double screen_tol,\n";
    ss << indent << "double * const restrict work,\n";
    ss << indent << "double * const restrict " << ArrVarName(am) << ")";
    return ss.str();
}